

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_policy_format_text.c
# Opt level: O1

int log_policy_format_text_create(log_policy policy,log_policy_ctor ctor)

{
  undefined4 *instance;
  undefined4 uVar1;
  int iVar2;
  
  instance = (undefined4 *)malloc(4);
  if (instance == (undefined4 *)0x0) {
    iVar2 = 1;
  }
  else {
    iVar2 = 0;
    uVar1 = 0;
    if (ctor != (log_policy_ctor)0x0) {
      uVar1 = *ctor;
    }
    *instance = uVar1;
    *instance = *ctor;
    log_policy_instantiate(policy,instance,1);
  }
  return iVar2;
}

Assistant:

static int log_policy_format_text_create(log_policy policy, const log_policy_ctor ctor)
{
	log_policy_format_text_data text_data = malloc(sizeof(struct log_policy_format_text_data_type));

	const log_policy_format_text_ctor text_ctor = ctor;

	if (text_data == NULL)
	{
		return 1;
	}

	if (text_ctor != NULL)
	{
		text_data->flags = text_ctor->flags;
	}
	else
	{
		text_data->flags = LOG_POLICY_FORMAT_TEXT_EMPTY;
	}

	text_data->flags = text_ctor->flags;

	log_policy_instantiate(policy, text_data, LOG_POLICY_FORMAT_TEXT);

	return 0;
}